

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O2

Statement *
slang::ast::TimedStatement::fromSyntax
          (Compilation *compilation,TimingControlStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TimedStatement *stmt;
  SourceRange local_38;
  TimingControl *timing;
  
  iVar1 = TimingControl::bind((int)(syntax->timingControl).ptr,(sockaddr *)context,
                              (socklen_t)context);
  timing = (TimingControl *)CONCAT44(extraout_var,iVar1);
  Statement::StatementContext::observeTiming(stmtCtx,timing);
  iVar1 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,(socklen_t)stmtCtx);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::TimedStatement,slang::ast::TimingControl&,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,timing,
                    (Statement *)CONCAT44(extraout_var_00,iVar1),&local_38);
  if ((timing->kind == Invalid) || (((Statement *)CONCAT44(extraout_var_00,iVar1))->kind == Invalid)
     ) {
    stmt = (TimedStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
  }
  return &stmt->super_Statement;
}

Assistant:

Statement& TimedStatement::fromSyntax(Compilation& compilation,
                                      const TimingControlStatementSyntax& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    auto& timing = TimingControl::bind(*syntax.timingControl, context);
    stmtCtx.observeTiming(timing);

    auto& stmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<TimedStatement>(timing, stmt, syntax.sourceRange());

    if (timing.bad() || stmt.bad())
        return badStmt(compilation, result);

    return *result;
}